

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGUIElement.h
# Opt level: O0

void __thiscall irr::gui::IGUIElement::setTabOrder(IGUIElement *this,s32 index)

{
  IGUIElement *pIVar1;
  int in_ESI;
  IGUIElement **in_RDI;
  bool bVar2;
  undefined1 unaff_retaddr;
  undefined1 unaff_retaddr_00;
  s32 unaff_retaddr_01;
  IGUIElement *in_stack_00000008;
  IGUIElement *closest;
  IGUIElement *first;
  IGUIElement *el;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_fffffffffffffff0;
  IGUIElement **first_00;
  
  if (in_ESI < 0) {
    *(undefined4 *)(in_RDI + 0x22) = 0;
    first_00 = in_RDI;
    pIVar1 = getTabGroup((IGUIElement *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    while( true ) {
      bVar2 = false;
      if (((*(byte *)((long)in_RDI + 0x114) & 1) != 0) &&
         (bVar2 = false, pIVar1 != (IGUIElement *)0x0)) {
        bVar2 = pIVar1->Parent != (IGUIElement *)0x0;
      }
      if (!bVar2) break;
      pIVar1 = pIVar1->Parent;
    }
    if (pIVar1 != (IGUIElement *)0x0) {
      getNextElement(in_stack_00000008,unaff_retaddr_01,(bool)unaff_retaddr_00,(bool)unaff_retaddr,
                     first_00,(IGUIElement **)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                     SUB81((ulong)pIVar1 >> 0x38,0),SUB81((ulong)pIVar1 >> 0x30,0));
    }
  }
  else {
    *(int *)(in_RDI + 0x22) = in_ESI;
  }
  return;
}

Assistant:

void setTabOrder(s32 index)
	{
		// negative = autonumber
		if (index < 0) {
			TabOrder = 0;
			IGUIElement *el = getTabGroup();
			while (IsTabGroup && el && el->Parent)
				el = el->Parent;

			IGUIElement *first = 0, *closest = 0;
			if (el) {
				// find the highest element number
				el->getNextElement(-1, true, IsTabGroup, first, closest, true, true);
				if (first) {
					TabOrder = first->getTabOrder() + 1;
				}
			}

		} else
			TabOrder = index;
	}